

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::Discreet3DSImporter(Discreet3DSImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0090a0b8;
  this->stream = (StreamReaderLE *)0x0;
  this->mLastNodeIndex = 0;
  this->mCurrentNode = (Node *)0x0;
  this->mRootNode = (Node *)0x0;
  this->mScene = (Scene *)0x0;
  (this->mClrAmbient).r = 0.0;
  (this->mClrAmbient).g = 0.0;
  *(undefined8 *)&(this->mClrAmbient).b = 0;
  (this->mBackgroundImage)._M_dataplus._M_p = (pointer)&(this->mBackgroundImage).field_2;
  (this->mBackgroundImage)._M_string_length = 0;
  (this->mBackgroundImage).field_2._M_local_buf[0] = '\0';
  this->bHasBG = false;
  this->bIsPrj = false;
  return;
}

Assistant:

Discreet3DSImporter::Discreet3DSImporter()
: stream()
, mLastNodeIndex()
, mCurrentNode()
, mRootNode()
, mScene()
, mMasterScale()
, bHasBG()
, bIsPrj() {
    // empty
}